

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlNodePtr xmlXPathNextAttribute(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlXPathContextPtr pxVar1;
  xmlDocPtr pxVar2;
  _xmlDtd **pp_Var3;
  
  if ((((ctxt != (xmlXPathParserContextPtr)0x0) &&
       (pxVar1 = ctxt->context, pxVar1 != (xmlXPathContextPtr)0x0)) &&
      (pxVar2 = (xmlDocPtr)pxVar1->node, pxVar2 != (xmlDocPtr)0x0)) &&
     (pxVar2->type == XML_ELEMENT_NODE)) {
    if (cur == (xmlNodePtr)0x0) {
      if (pxVar2 == pxVar1->doc) {
        return (xmlNodePtr)0x0;
      }
      pp_Var3 = &pxVar2->extSubset;
    }
    else {
      pp_Var3 = (_xmlDtd **)&cur->next;
    }
    return (xmlNodePtr)*pp_Var3;
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlXPathNextAttribute(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (ctxt->context->node == NULL)
	return(NULL);
    if (ctxt->context->node->type != XML_ELEMENT_NODE)
	return(NULL);
    if (cur == NULL) {
        if (ctxt->context->node == (xmlNodePtr) ctxt->context->doc)
	    return(NULL);
        return((xmlNodePtr)ctxt->context->node->properties);
    }
    return((xmlNodePtr)cur->next);
}